

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall ProblemTest_AddVar_Test::TestBody(ProblemTest_AddVar_Test *this)

{
  bool bVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  MutVariable MVar6;
  AssertionResult gtest_ar;
  Problem p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  AssertHelper local_398;
  internal local_390 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  BasicProblem<mp::BasicProblemParams<int>_> local_380;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_380);
  local_3a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_3a0.ptr_._4_4_ << 0x20);
  local_398.data_._0_4_ =
       (int)((ulong)((long)local_380.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_380.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  testing::internal::CmpHelperEQ<int,int>
            (local_390,"0","p.num_vars()",(int *)&local_3a0,(int *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               100,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&local_380,1.1,2.2,CONTINUOUS);
  local_3a0.ptr_._0_4_ = 1;
  local_398.data_._0_4_ =
       (int)((ulong)((long)local_380.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_380.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  testing::internal::CmpHelperEQ<int,int>
            (local_390,"1","p.num_vars()",(int *)&local_3a0,(int *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x66,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_380,0);
  pBVar2 = MVar6.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3a0.ptr_ = local_3a0.ptr_ & 0xffffffff00000000;
  local_398.data_._0_4_ =
       MVar6.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  testing::internal::CmpHelperEQ<int,int>
            (local_390,"0","cvar.index()",(int *)&local_3a0,(int *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ff199999999999a;
  uVar5 = (ulong)MVar6.
                 super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_398.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar5].lb;
  testing::internal::CmpHelperEQ<double,double>
            (local_390,"1.1","cvar.lb()",(double *)&local_3a0,(double *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_400199999999999a;
  local_398.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar5].ub;
  testing::internal::CmpHelperEQ<double,double>
            (local_390,"2.2","cvar.ub()",(double *)&local_3a0,(double *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_ = local_3a0.ptr_ & 0xffffffff00000000;
  uVar3 = uVar5 + 0x3f;
  if (-1 < (long)uVar5) {
    uVar3 = uVar5;
  }
  local_398.data_._0_4_ =
       (uint)(((pBVar2->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar3 >> 6) +
                (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar5 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            (local_390,"mp::var::CONTINUOUS","cvar.type()",(Type *)&local_3a0,(Type *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&local_380,3.3,4.4,INTEGER);
  local_3a0.ptr_._0_4_ = 2;
  local_398.data_._0_4_ =
       (int)((ulong)((long)local_380.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_380.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  testing::internal::CmpHelperEQ<int,int>
            (local_390,"2","p.num_vars()",(int *)&local_3a0,(int *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_380,1);
  pBVar2 = MVar6.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3a0.ptr_._0_4_ = 1;
  local_398.data_._0_4_ =
       MVar6.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  testing::internal::CmpHelperEQ<int,int>
            (local_390,"1","var.index()",(int *)&local_3a0,(int *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x70,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_400a666666666666;
  uVar5 = (ulong)MVar6.
                 super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_398.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar5].lb;
  testing::internal::CmpHelperEQ<double,double>
            (local_390,"3.3","var.lb()",(double *)&local_3a0,(double *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x71,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_401199999999999a;
  local_398.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar5].ub;
  testing::internal::CmpHelperEQ<double,double>
            (local_390,"4.4","var.ub()",(double *)&local_3a0,(double *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x72,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ptr_._0_4_ = 1;
  uVar3 = uVar5 + 0x3f;
  if (-1 < (long)uVar5) {
    uVar3 = uVar5;
  }
  local_398.data_._0_4_ =
       (uint)(((pBVar2->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar3 >> 6) +
                (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar5 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            (local_390,"mp::var::INTEGER","var.type()",(Type *)&local_3a0,(Type *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x73,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
      local_3a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_380);
  return;
}

Assistant:

TEST(ProblemTest, AddVar) {
  Problem p;
  EXPECT_EQ(0, p.num_vars());
  p.AddVar(1.1, 2.2);
  EXPECT_EQ(1, p.num_vars());
  Problem::Variable var = p.var(0);
  const Problem::Variable cvar = var;
  EXPECT_EQ(0, cvar.index());
  EXPECT_EQ(1.1, cvar.lb());
  EXPECT_EQ(2.2, cvar.ub());
  EXPECT_EQ(mp::var::CONTINUOUS, cvar.type());
  p.AddVar(3.3, 4.4, mp::var::INTEGER);
  EXPECT_EQ(2, p.num_vars());
  var = p.var(1);
  EXPECT_EQ(1, var.index());
  EXPECT_EQ(3.3, var.lb());
  EXPECT_EQ(4.4, var.ub());
  EXPECT_EQ(mp::var::INTEGER, var.type());
}